

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jcmainct.c
# Opt level: O0

void jinit_c_main_controller(j_compress_ptr cinfo,boolean need_full_buffer)

{
  undefined8 *puVar1;
  undefined8 uVar2;
  int in_ESI;
  long *in_RDI;
  jpeg_component_info *compptr;
  int ci;
  my_main_ptr main;
  long local_28;
  int local_1c;
  
  puVar1 = (undefined8 *)(**(code **)in_RDI[1])(in_RDI,1,0x70);
  in_RDI[0x3f] = (long)puVar1;
  *puVar1 = start_pass_main;
  if ((int)in_RDI[0x24] == 0) {
    if (in_ESI == 0) {
      local_1c = 0;
      local_28 = in_RDI[0xd];
      for (; local_1c < *(int *)((long)in_RDI + 0x5c); local_1c = local_1c + 1) {
        uVar2 = (**(code **)(in_RDI[1] + 0x10))
                          (in_RDI,1,*(int *)(local_28 + 0x1c) * *(int *)(local_28 + 0x24),
                           *(int *)(local_28 + 0xc) * *(int *)(local_28 + 0x28));
        puVar1[(long)local_1c + 4] = uVar2;
        local_28 = local_28 + 0x60;
      }
    }
    else {
      *(undefined4 *)(*in_RDI + 0x28) = 3;
      (**(code **)*in_RDI)(in_RDI);
    }
  }
  return;
}

Assistant:

GLOBAL(void)
jinit_c_main_controller (j_compress_ptr cinfo, boolean need_full_buffer)
{
  my_main_ptr main;
  int ci;
  jpeg_component_info *compptr;

  main = (my_main_ptr)
    (*cinfo->mem->alloc_small) ((j_common_ptr) cinfo, JPOOL_IMAGE,
				SIZEOF(my_main_controller));
  cinfo->main = (struct jpeg_c_main_controller *) main;
  main->pub.start_pass = start_pass_main;

  /* We don't need to create a buffer in raw-data mode. */
  if (cinfo->raw_data_in)
    return;

  /* Create the buffer.  It holds downsampled data, so each component
   * may be of a different size.
   */
  if (need_full_buffer) {
#ifdef FULL_MAIN_BUFFER_SUPPORTED
    /* Allocate a full-image virtual array for each component */
    /* Note we pad the bottom to a multiple of the iMCU height */
    for (ci = 0, compptr = cinfo->comp_info; ci < cinfo->num_components;
	 ci++, compptr++) {
      main->whole_image[ci] = (*cinfo->mem->request_virt_sarray)
	((j_common_ptr) cinfo, JPOOL_IMAGE, FALSE,
	 compptr->width_in_blocks * compptr->DCT_h_scaled_size,
	 (JDIMENSION) jround_up((long) compptr->height_in_blocks,
				(long) compptr->v_samp_factor) * DCTSIZE,
	 (JDIMENSION) (compptr->v_samp_factor * compptr->DCT_v_scaled_size));
    }
#else
    ERREXIT(cinfo, JERR_BAD_BUFFER_MODE);
#endif
  } else {
#ifdef FULL_MAIN_BUFFER_SUPPORTED
    main->whole_image[0] = NULL; /* flag for no virtual arrays */
#endif
    /* Allocate a strip buffer for each component */
    for (ci = 0, compptr = cinfo->comp_info; ci < cinfo->num_components;
	 ci++, compptr++) {
      main->buffer[ci] = (*cinfo->mem->alloc_sarray)
	((j_common_ptr) cinfo, JPOOL_IMAGE,
	 compptr->width_in_blocks * compptr->DCT_h_scaled_size,
	 (JDIMENSION) (compptr->v_samp_factor * compptr->DCT_v_scaled_size));
    }
  }
}